

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O2

bool __thiscall JumpBasic::foldInGuards(JumpBasic *this,Funcdata *fd,JumpTable *jump)

{
  pointer pGVar1;
  long lVar2;
  int iVar3;
  undefined8 *puVar4;
  int4 i;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  
  lVar7 = 0;
  bVar6 = 0;
  for (uVar5 = 0;
      pGVar1 = (this->selectguards).super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(this->selectguards).
                             super__Vector_base<GuardRecord,_std::allocator<GuardRecord>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pGVar1) / 0x48);
      uVar5 = uVar5 + 1) {
    lVar2 = *(long *)((long)&pGVar1->cbranch + lVar7);
    if (lVar2 != 0) {
      puVar4 = (undefined8 *)((long)&pGVar1->cbranch + lVar7);
      if ((*(byte *)(lVar2 + 8) & 0x20) == 0) {
        iVar3 = (*(this->super_JumpModel)._vptr_JumpModel[0xf])(this,fd,puVar4,jump);
        bVar6 = bVar6 | (byte)iVar3;
      }
      else {
        *puVar4 = 0;
      }
    }
    lVar7 = lVar7 + 0x48;
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool JumpBasic::foldInGuards(Funcdata *fd,JumpTable *jump)

{ // We now think of the BRANCHIND as encompassing
  // the guard function, so we "disarm" the guard
  // instructions by making the guard condition
  // always false.  If the simplification removes
  // the unusable branches, we are left with only
  // one path through the switch
  bool change = false;
  for(int4 i=0;i<selectguards.size();++i) {
    PcodeOp *cbranch = selectguards[i].getBranch();
    if (cbranch == (PcodeOp *)0) continue; // Already normalized
    if (cbranch->isDead()) {
      selectguards[i].clear();
      continue;
    }
    if (foldInOneGuard(fd,selectguards[i],jump))
      change = true;
  }
  return change;
}